

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.cpp
# Opt level: O3

void __thiscall o3dgc::Arithmetic_Codec::read_from_file(Arithmetic_Codec *this,FILE *code_file)

{
  uint uVar1;
  size_t sVar2;
  byte bVar3;
  uint uVar4;
  
  uVar4 = 0;
  bVar3 = 0;
  do {
    uVar1 = getc((FILE *)code_file);
    if (uVar1 == 0xffffffff) goto LAB_006921d3;
    uVar4 = uVar4 | (uVar1 & 0x7f) << (bVar3 & 0x1f);
    bVar3 = bVar3 + 7;
  } while ((char)uVar1 < '\0');
  if (this->buffer_size < uVar4) {
    AC_Error("code buffer overflow");
  }
  sVar2 = fread(this->code_buffer,1,(ulong)uVar4,(FILE *)code_file);
  if (sVar2 == uVar4) {
    start_decoder(this);
    return;
  }
LAB_006921d3:
  AC_Error("cannot read code from file");
}

Assistant:

void Arithmetic_Codec::read_from_file(FILE * code_file)
    {
      unsigned shift = 0, code_bytes = 0;
      int file_byte;
                          // read variable-length header with number of code bytes
      do {
        if ((file_byte = getc(code_file)) == EOF)
          AC_Error("cannot read code from file");
        code_bytes |= unsigned(file_byte & 0x7F) << shift;
        shift += 7;
      } while (file_byte & 0x80);
                                                           // read compressed data
      if (code_bytes > buffer_size) AC_Error("code buffer overflow");
      if (fread(code_buffer, 1, code_bytes, code_file) != code_bytes)
        AC_Error("cannot read code from file");

      start_decoder();                                       // initialize decoder
    }